

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

AssertionExpr *
slang::ast::ClockingAssertionExpr::fromSyntax
          (SignalEventExpressionSyntax *syntax,ASTContext *context)

{
  Compilation *compilation;
  int iVar1;
  AssertionExpr *pAVar2;
  undefined4 extraout_var;
  ClockingAssertionExpr *pCVar3;
  socklen_t __len;
  SourceRange sourceRange;
  ASTContext AStack_58;
  
  compilation = ((context->scope).ptr)->compilation;
  if (((context->flags).m_bits & 0x40000) == 0) {
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    ASTContext::addDiag(context,(DiagCode)0x270008,sourceRange);
    pAVar2 = AssertionExpr::badExpr(compilation,(AssertionExpr *)0x0);
    return pAVar2;
  }
  ASTContext::resetFlags(&AStack_58,context,(bitmask<slang::ast::ASTFlags>)0x20);
  iVar1 = TimingControl::bind((int)syntax,(sockaddr *)&AStack_58,__len);
  pAVar2 = AssertionExpr::badExpr(compilation,(AssertionExpr *)0x0);
  pCVar3 = BumpAllocator::
           emplace<slang::ast::ClockingAssertionExpr,slang::ast::TimingControl&,slang::ast::AssertionExpr&>
                     (&compilation->super_BumpAllocator,
                      (TimingControl *)CONCAT44(extraout_var,iVar1),pAVar2);
  return &pCVar3->super_AssertionExpr;
}

Assistant:

AssertionExpr& ClockingAssertionExpr::fromSyntax(const SignalEventExpressionSyntax& syntax,
                                                 const ASTContext& context) {
    // If we are creating an argument then assume it's possible it could be used in an
    // event expression and allow this. Actual usage later on will report an error if
    // this ends up not being true. Otherwise this is just an error.
    auto& comp = context.getCompilation();
    if (!context.flags.has(ASTFlags::AssertionInstanceArgCheck)) {
        context.addDiag(diag::InvalidSignalEventInSeq, syntax.sourceRange());
        return badExpr(comp, nullptr);
    }

    auto& clocking = TimingControl::bind(syntax, context.resetFlags(ASTFlags::NonProcedural));
    return *comp.emplace<ClockingAssertionExpr>(clocking, badExpr(comp, nullptr));
}